

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# net.cpp
# Opt level: O0

bool __thiscall V2Transport::ReceivedBytes(V2Transport *this,Span<const_unsigned_char> *msg_bytes)

{
  long lVar1;
  bool bVar2;
  const_iterator __position;
  unsigned_long *puVar3;
  uchar *puVar4;
  uchar *puVar5;
  size_t sVar6;
  undefined8 *in_RSI;
  V2Transport *in_RDI;
  long in_FS_OFFSET;
  Span<const_unsigned_char> SVar7;
  size_t alloc_add;
  size_t max_read;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock48;
  undefined4 in_stack_fffffffffffffee8;
  int in_stack_fffffffffffffeec;
  undefined7 in_stack_fffffffffffffef0;
  undefined1 in_stack_fffffffffffffef7;
  Span<const_unsigned_char> *in_stack_fffffffffffffef8;
  iterator in_stack_ffffffffffffff00;
  bool *in_stack_ffffffffffffff08;
  char *in_stack_ffffffffffffff10;
  vector<unsigned_char,_std::allocator<unsigned_char>_> *__last;
  V2Transport *in_stack_ffffffffffffff18;
  Span<const_unsigned_char> *in_stack_ffffffffffffff20;
  V2Transport *in_stack_ffffffffffffff28;
  V2Transport *this_00;
  bool local_63;
  uchar *local_60;
  size_t sStack_58;
  V2Transport *in_stack_ffffffffffffffd0;
  
  lVar1 = *(long *)(in_FS_OFFSET + 0x28);
  this_00 = in_RDI;
  AssertLockNotHeldInline
            ((char *)in_stack_fffffffffffffef8,
             (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
             in_stack_fffffffffffffeec,(Mutex *)0x20b01b);
  MaybeCheckNotHeld((Mutex *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  UniqueLock<AnnotatedMixin<std::mutex>_>::UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)in_stack_ffffffffffffff28,
             (AnnotatedMixin<std::mutex> *)in_stack_ffffffffffffff20,
             (char *)in_stack_ffffffffffffff18,in_stack_ffffffffffffff10,
             (int)((ulong)in_stack_ffffffffffffff08 >> 0x20),
             SUB81((ulong)in_stack_ffffffffffffff08 >> 0x18,0));
  if (in_RDI->m_recv_state == V1) {
    local_63 = V1Transport::ReceivedBytes
                         ((V1Transport *)in_stack_ffffffffffffff28,in_stack_ffffffffffffff20);
  }
  else {
    while (bVar2 = Span<const_unsigned_char>::empty
                             ((Span<const_unsigned_char> *)
                              CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8)),
          ((bVar2 ^ 0xffU) & 1) != 0) {
      GetMaxBytesToProcess(in_stack_ffffffffffffff18);
      __position._M_current =
           (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                              ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                               CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      Span<const_unsigned_char>::size
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      puVar3 = std::min<unsigned_long>
                         ((unsigned_long *)
                          CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                          (unsigned_long *)
                          CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      puVar4 = __position._M_current + *puVar3;
      puVar5 = (uchar *)std::vector<unsigned_char,_std::allocator<unsigned_char>_>::capacity
                                  ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                   CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      if (puVar5 < puVar4) {
        switch(in_RDI->m_recv_state) {
        case KEY_MAYBE_V1:
        case KEY:
        case GARB_GARBTERM:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffff28,(size_type)in_stack_ffffffffffffff20);
          break;
        case VERSION:
        case APP:
          sVar6 = Span<const_unsigned_char>::size
                            ((Span<const_unsigned_char> *)
                             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          in_stack_ffffffffffffffd0 = (V2Transport *)(sVar6 + 0x40000);
          std::min<unsigned_long>
                    ((unsigned_long *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                     (unsigned_long *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
          ;
          in_stack_ffffffffffffff28 = (V2Transport *)&in_RDI->m_recv_buffer;
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::size
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::reserve
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_ffffffffffffff28,(size_type)in_stack_ffffffffffffff20);
          break;
        case APP_READY:
          std::vector<unsigned_char,_std::allocator<unsigned_char>_>::empty
                    ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                     in_stack_fffffffffffffef8);
          inline_assertion_check<false,bool>
                    (in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00._M_current,
                     (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
          break;
        case V1:
          inline_assertion_check<false,bool>
                    (in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00._M_current,
                     (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                     (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                     (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
        }
      }
      Span<const_unsigned_char>::size
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      in_stack_ffffffffffffff20 =
           (Span<const_unsigned_char> *)
           std::min<unsigned_long>
                     ((unsigned_long *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0)
                      ,(unsigned_long *)
                       CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      __last = &in_RDI->m_recv_buffer;
      std::vector<unsigned_char,_std::allocator<unsigned_char>_>::end
                ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                 CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      __gnu_cxx::
      __normal_iterator<unsigned_char_const*,std::vector<unsigned_char,std::allocator<unsigned_char>>>
      ::__normal_iterator<unsigned_char*>
                ((__normal_iterator<const_unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)in_stack_fffffffffffffef8,
                 (__normal_iterator<unsigned_char_*,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      Span<const_unsigned_char>::data
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      in_stack_ffffffffffffff18 =
           (V2Transport *)
           UCharCast((uchar *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      Span<const_unsigned_char>::data
                ((Span<const_unsigned_char> *)
                 CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      in_stack_ffffffffffffff08 =
           (bool *)UCharCast((uchar *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8))
      ;
      in_stack_ffffffffffffff00 =
           std::vector<unsigned_char,std::allocator<unsigned_char>>::
           insert<unsigned_char_const*,void>
                     ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                      in_stack_ffffffffffffff20,__position,(uchar *)in_stack_ffffffffffffff18,
                      (uchar *)__last);
      SVar7 = Span<const_unsigned_char>::subspan
                        (in_stack_fffffffffffffef8,
                         CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0));
      local_60 = SVar7.m_data;
      sStack_58 = SVar7.m_size;
      *in_RSI = local_60;
      in_RSI[1] = sStack_58;
      in_stack_fffffffffffffef8 = (Span<const_unsigned_char> *)(ulong)in_RDI->m_recv_state;
      switch(in_stack_fffffffffffffef8) {
      case (Span<const_unsigned_char> *)0x0:
        ProcessReceivedMaybeV1Bytes(in_RDI);
        if (in_RDI->m_recv_state == V1) {
          local_63 = true;
          goto LAB_0020b565;
        }
        break;
      case (Span<const_unsigned_char> *)0x1:
        bVar2 = ProcessReceivedKeyBytes(in_stack_ffffffffffffffd0);
        if (!bVar2) {
          local_63 = false;
          goto LAB_0020b565;
        }
        break;
      case (Span<const_unsigned_char> *)0x2:
        bVar2 = ProcessReceivedGarbageBytes(in_stack_ffffffffffffff28);
        if (!bVar2) {
          local_63 = false;
          goto LAB_0020b565;
        }
        break;
      case (Span<const_unsigned_char> *)0x3:
      case (Span<const_unsigned_char> *)0x4:
        bVar2 = ProcessReceivedPacketBytes(this_00);
        if (!bVar2) {
          local_63 = false;
          goto LAB_0020b565;
        }
        break;
      case (Span<const_unsigned_char> *)0x5:
        local_63 = true;
        goto LAB_0020b565;
      case (Span<const_unsigned_char> *)0x6:
        inline_assertion_check<false,bool>
                  (in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00._M_current,0,
                   (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                   (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
      }
      inline_assertion_check<false,bool>
                (in_stack_ffffffffffffff08,(char *)in_stack_ffffffffffffff00._M_current,
                 (int)((ulong)in_stack_fffffffffffffef8 >> 0x20),
                 (char *)CONCAT17(in_stack_fffffffffffffef7,in_stack_fffffffffffffef0),
                 (char *)CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
    }
    local_63 = true;
  }
LAB_0020b565:
  UniqueLock<AnnotatedMixin<std::mutex>_>::~UniqueLock
            ((UniqueLock<AnnotatedMixin<std::mutex>_> *)
             CONCAT44(in_stack_fffffffffffffeec,in_stack_fffffffffffffee8));
  if (*(long *)(in_FS_OFFSET + 0x28) != lVar1) {
    __stack_chk_fail();
  }
  return local_63;
}

Assistant:

bool V2Transport::ReceivedBytes(Span<const uint8_t>& msg_bytes) noexcept
{
    AssertLockNotHeld(m_recv_mutex);
    /** How many bytes to allocate in the receive buffer at most above what is received so far. */
    static constexpr size_t MAX_RESERVE_AHEAD = 256 * 1024;

    LOCK(m_recv_mutex);
    if (m_recv_state == RecvState::V1) return m_v1_fallback.ReceivedBytes(msg_bytes);

    // Process the provided bytes in msg_bytes in a loop. In each iteration a nonzero number of
    // bytes (decided by GetMaxBytesToProcess) are taken from the beginning om msg_bytes, and
    // appended to m_recv_buffer. Then, depending on the receiver state, one of the
    // ProcessReceived*Bytes functions is called to process the bytes in that buffer.
    while (!msg_bytes.empty()) {
        // Decide how many bytes to copy from msg_bytes to m_recv_buffer.
        size_t max_read = GetMaxBytesToProcess();

        // Reserve space in the buffer if there is not enough.
        if (m_recv_buffer.size() + std::min(msg_bytes.size(), max_read) > m_recv_buffer.capacity()) {
            switch (m_recv_state) {
            case RecvState::KEY_MAYBE_V1:
            case RecvState::KEY:
            case RecvState::GARB_GARBTERM:
                // During the initial states (key/garbage), allocate once to fit the maximum (4111
                // bytes).
                m_recv_buffer.reserve(MAX_GARBAGE_LEN + BIP324Cipher::GARBAGE_TERMINATOR_LEN);
                break;
            case RecvState::VERSION:
            case RecvState::APP: {
                // During states where a packet is being received, as much as is expected but never
                // more than MAX_RESERVE_AHEAD bytes in addition to what is received so far.
                // This means attackers that want to cause us to waste allocated memory are limited
                // to MAX_RESERVE_AHEAD above the largest allowed message contents size, and to
                // MAX_RESERVE_AHEAD more than they've actually sent us.
                size_t alloc_add = std::min(max_read, msg_bytes.size() + MAX_RESERVE_AHEAD);
                m_recv_buffer.reserve(m_recv_buffer.size() + alloc_add);
                break;
            }
            case RecvState::APP_READY:
                // The buffer is empty in this state.
                Assume(m_recv_buffer.empty());
                break;
            case RecvState::V1:
                // Should have bailed out above.
                Assume(false);
                break;
            }
        }

        // Can't read more than provided input.
        max_read = std::min(msg_bytes.size(), max_read);
        // Copy data to buffer.
        m_recv_buffer.insert(m_recv_buffer.end(), UCharCast(msg_bytes.data()), UCharCast(msg_bytes.data() + max_read));
        msg_bytes = msg_bytes.subspan(max_read);

        // Process data in the buffer.
        switch (m_recv_state) {
        case RecvState::KEY_MAYBE_V1:
            ProcessReceivedMaybeV1Bytes();
            if (m_recv_state == RecvState::V1) return true;
            break;

        case RecvState::KEY:
            if (!ProcessReceivedKeyBytes()) return false;
            break;

        case RecvState::GARB_GARBTERM:
            if (!ProcessReceivedGarbageBytes()) return false;
            break;

        case RecvState::VERSION:
        case RecvState::APP:
            if (!ProcessReceivedPacketBytes()) return false;
            break;

        case RecvState::APP_READY:
            return true;

        case RecvState::V1:
            // We should have bailed out before.
            Assume(false);
            break;
        }
        // Make sure we have made progress before continuing.
        Assume(max_read > 0);
    }

    return true;
}